

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxAnalysis.h
# Opt level: O0

shared_ptr<const_calc4::Operator> __thiscall
calc4::LoadVariableToken::CreateOperator
          (LoadVariableToken *this,
          vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          *operands,CompilationContext *context)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_calc4::Operator> *in_RDI;
  shared_ptr<const_calc4::Operator> sVar1;
  shared_ptr<const_calc4::LoadVariableOperator> *in_stack_ffffffffffffffb8;
  shared_ptr<const_calc4::Operator> *this_00;
  string *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  LoadVariableOperator::Create(in_stack_ffffffffffffffd8);
  std::shared_ptr<calc4::Operator_const>::shared_ptr<calc4::LoadVariableOperator_const,void>
            (this_00,in_stack_ffffffffffffffb8);
  std::shared_ptr<const_calc4::LoadVariableOperator>::~shared_ptr
            ((shared_ptr<const_calc4::LoadVariableOperator> *)0x17c801);
  sVar1.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<const_calc4::Operator>)
         sVar1.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const Operator> CreateOperator(
        const std::vector<std::shared_ptr<const Operator>>& operands,
        CompilationContext& context) const override
    {
        return LoadVariableOperator::Create(supplementaryText);
    }